

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

unsigned_long __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<unsigned_long>
          (TypedConfigurations *this,Level level,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,char *confName)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  pointer ppVar3;
  key_type local_44;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  char *confName_local;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *confMap_local;
  TypedConfigurations *pTStack_18;
  Level level_local;
  TypedConfigurations *this_local;
  
  it._M_node = (_Base_ptr)confName;
  confMap_local._4_4_ = level;
  pTStack_18 = this;
  local_38._M_node =
       (_Base_ptr)
       utils::std::
       map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
       ::find(confMap,(key_type *)((long)&confMap_local + 4));
  local_40._M_node =
       (_Base_ptr)
       utils::std::
       map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
       ::end(confMap);
  bVar1 = utils::std::operator==(&local_38,&local_40);
  if (bVar1) {
    local_44 = Global;
    pmVar2 = utils::std::
             map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
             ::at(confMap,&local_44);
    this_local = (TypedConfigurations *)*pmVar2;
  }
  else {
    ppVar3 = utils::std::_Rb_tree_const_iterator<std::pair<const_el::Level,_unsigned_long>_>::
             operator->(&local_38);
    this_local = (TypedConfigurations *)ppVar3->second;
  }
  return (unsigned_long)this_local;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }